

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O3

PatternSyntax * __thiscall slang::parsing::Parser::parsePattern(Parser *this)

{
  bool bVar1;
  TokenKind TVar2;
  int iVar3;
  PatternSyntax *pPVar4;
  ParenthesizedPatternSyntax *pPVar5;
  ExpressionSyntax *expr;
  ExpressionPatternSyntax *pEVar6;
  SourceLocation SVar7;
  WildcardPatternSyntax *pWVar8;
  TaggedPatternSyntax *pTVar9;
  VariablePatternSyntax *pVVar10;
  OrderedStructurePatternMemberSyntax *pOVar11;
  StructurePatternMemberSyntax *pSVar12;
  undefined4 extraout_var;
  StructurePatternSyntax *pSVar13;
  Info *extraout_RDX;
  Info *extraout_RDX_00;
  Info *src;
  TokenKind TVar14;
  ulong uVar15;
  Token TVar16;
  Token TVar17;
  Token TVar18;
  Token openBrace;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> buffer;
  Token local_110;
  Token local_100;
  Info *local_f0;
  undefined8 local_e8;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_e0;
  ulong local_d0;
  undefined8 uStack_c8;
  undefined8 local_b8;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_a8 [2];
  
  TVar16 = ParserBase::peek(&this->super_ParserBase);
  TVar2 = TVar16.kind;
  if (Comma < TVar2) {
    if (TVar2 == Dot) {
      TVar16 = ParserBase::consume(&this->super_ParserBase);
      bVar1 = ParserBase::peek(&this->super_ParserBase,Star);
      if (bVar1) {
        TVar17 = ParserBase::consume(&this->super_ParserBase);
        pWVar8 = syntax::SyntaxFactory::wildcardPattern(&this->factory,TVar16,TVar17);
        return &pWVar8->super_PatternSyntax;
      }
      TVar17 = ParserBase::expect(&this->super_ParserBase,Identifier);
      pVVar10 = syntax::SyntaxFactory::variablePattern(&this->factory,TVar16,TVar17);
      return &pVVar10->super_PatternSyntax;
    }
    if (TVar2 == TaggedKeyword) {
      TVar16 = ParserBase::consume(&this->super_ParserBase);
      TVar17 = ParserBase::expect(&this->super_ParserBase,Identifier);
      TVar18 = ParserBase::peek(&this->super_ParserBase);
      bVar1 = syntax::SyntaxFacts::isPossiblePattern(TVar18.kind);
      if (bVar1) {
        pPVar4 = parsePattern(this);
      }
      else {
        pPVar4 = (PatternSyntax *)0x0;
      }
      pTVar9 = syntax::SyntaxFactory::taggedPattern(&this->factory,TVar16,TVar17,pPVar4);
      return &pTVar9->super_PatternSyntax;
    }
LAB_001d1569:
    expr = parseSubExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x1,0);
    pEVar6 = syntax::SyntaxFactory::expressionPattern(&this->factory,expr);
    return &pEVar6->super_PatternSyntax;
  }
  if (TVar2 != ApostropheOpenBrace) {
    if (TVar2 == OpenParenthesis) {
      TVar16 = ParserBase::consume(&this->super_ParserBase);
      pPVar4 = parsePattern(this);
      TVar17 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
      pPVar5 = syntax::SyntaxFactory::parenthesizedPattern(&this->factory,TVar16,pPVar4,TVar17);
      return &pPVar5->super_PatternSyntax;
    }
    goto LAB_001d1569;
  }
  TVar16 = ParserBase::consume(&this->super_ParserBase);
  local_f0 = TVar16.info;
  local_e8 = TVar16._0_8_;
  Token::Token(&local_110);
  local_a8[0].data_ = (pointer)local_a8[0].firstElement;
  local_a8[0].len = 0;
  local_a8[0].cap = 4;
  bVar1 = ParserBase::peek(&this->super_ParserBase,Identifier);
  if (bVar1) {
    TVar16 = ParserBase::peek(&this->super_ParserBase,1);
    if (TVar16.kind != Colon) goto LAB_001d16b7;
    TVar17 = ParserBase::peek(&this->super_ParserBase);
    local_100 = TVar17;
    bVar1 = syntax::SyntaxFacts::isCloseBrace(TVar17.kind);
    if (bVar1) {
      bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
      if (!bVar1) {
        SVar7 = Token::location(&local_100);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x4c0005,SVar7);
      }
      local_110 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
    }
    else {
      bVar1 = syntax::SyntaxFacts::isIdentifierOrComma(TVar17.kind);
      if (!bVar1) {
        ParserBase::reportMissingList
                  (&this->super_ParserBase,TVar17,CloseBrace,&local_110,(DiagCode)0x4c0005);
        src = extraout_RDX_00;
        goto LAB_001d1a6f;
      }
      while( true ) {
        pSVar12 = parseMemberPattern(this);
        local_e0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pSVar12;
        local_d0 = CONCAT71(local_d0._1_7_,1);
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (local_a8,(TokenOrSyntax *)&local_e0._M_first);
        TVar16 = ParserBase::peek(&this->super_ParserBase);
        TVar14 = TVar16.kind;
        bVar1 = syntax::SyntaxFacts::isCloseBrace(TVar14);
        if (TVar14 == EndOfFile || bVar1) break;
        if (TVar14 != Comma) {
          ParserBase::expect(&this->super_ParserBase,Comma);
          do {
            bVar1 = ParserBase::
                    skipBadTokens<&slang::syntax::SyntaxFacts::isIdentifierOrComma,&slang::syntax::SyntaxFacts::isCloseBrace>
                              (&this->super_ParserBase,(DiagCode)0x4c0005,false);
            if (!bVar1) {
              local_110 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
              goto LAB_001d1a65;
            }
            bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
          } while (!bVar1);
        }
        local_e0._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,Comma);
        local_d0 = local_d0 & 0xffffffffffffff00;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (local_a8,(TokenOrSyntax *)&local_e0._M_first);
        TVar16 = ParserBase::peek(&this->super_ParserBase);
        TVar14 = TVar16.kind;
        bVar1 = syntax::SyntaxFacts::isCloseBrace(TVar14);
        if (TVar14 == EndOfFile || bVar1) {
          ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          break;
        }
        if (TVar17.info == TVar16.info && TVar17.kind == TVar14) {
          bVar1 = ParserBase::
                  skipBadTokens<&slang::syntax::SyntaxFacts::isIdentifierOrComma,&slang::syntax::SyntaxFacts::isCloseBrace>
                            (&this->super_ParserBase,(DiagCode)0x4c0005,true);
          if (!bVar1) break;
        }
        uVar15 = TVar16._0_8_ & 0xffffffff;
        TVar17.info = TVar16.info;
        TVar17.kind = (short)uVar15;
        TVar17._2_1_ = (char)(uVar15 >> 0x10);
        TVar17.numFlags.raw = (char)(uVar15 >> 0x18);
        TVar17.rawLen = (int)(uVar15 >> 0x20);
        local_100 = TVar16;
      }
      local_110 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
    }
  }
  else {
LAB_001d16b7:
    TVar16 = ParserBase::peek(&this->super_ParserBase);
    local_100 = TVar16;
    bVar1 = syntax::SyntaxFacts::isCloseBrace(TVar16.kind);
    if (bVar1) {
      bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
      if (!bVar1) {
        SVar7 = Token::location(&local_100);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x4c0005,SVar7);
      }
      local_110 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
    }
    else {
      bVar1 = syntax::SyntaxFacts::isPossiblePatternOrComma(TVar16.kind);
      if (!bVar1) {
        ParserBase::reportMissingList
                  (&this->super_ParserBase,TVar16,CloseBrace,&local_110,(DiagCode)0x4c0005);
        src = extraout_RDX;
        goto LAB_001d1a6f;
      }
      while( true ) {
        pPVar4 = parsePattern(this);
        pOVar11 = syntax::SyntaxFactory::orderedStructurePatternMember(&this->factory,pPVar4);
        local_e0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pOVar11;
        local_d0 = CONCAT71(local_d0._1_7_,1);
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (local_a8,(TokenOrSyntax *)&local_e0._M_first);
        TVar17 = ParserBase::peek(&this->super_ParserBase);
        TVar14 = TVar17.kind;
        bVar1 = syntax::SyntaxFacts::isCloseBrace(TVar14);
        if (TVar14 == EndOfFile || bVar1) break;
        if (TVar14 != Comma) {
          ParserBase::expect(&this->super_ParserBase,Comma);
          do {
            bVar1 = ParserBase::
                    skipBadTokens<&slang::syntax::SyntaxFacts::isPossiblePatternOrComma,&slang::syntax::SyntaxFacts::isCloseBrace>
                              (&this->super_ParserBase,(DiagCode)0x4c0005,false);
            if (!bVar1) {
              local_110 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
              goto LAB_001d1a65;
            }
            bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
          } while (!bVar1);
        }
        local_e0._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,Comma);
        local_d0 = local_d0 & 0xffffffffffffff00;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (local_a8,(TokenOrSyntax *)&local_e0._M_first);
        TVar17 = ParserBase::peek(&this->super_ParserBase);
        TVar14 = TVar17.kind;
        bVar1 = syntax::SyntaxFacts::isCloseBrace(TVar14);
        if (TVar14 == EndOfFile || bVar1) {
          ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          break;
        }
        if (TVar16.info == TVar17.info && TVar16.kind == TVar14) {
          bVar1 = ParserBase::
                  skipBadTokens<&slang::syntax::SyntaxFacts::isPossiblePatternOrComma,&slang::syntax::SyntaxFacts::isCloseBrace>
                            (&this->super_ParserBase,(DiagCode)0x4c0005,true);
          if (!bVar1) break;
        }
        uVar15 = TVar17._0_8_ & 0xffffffff;
        TVar16.info = TVar17.info;
        TVar16.kind = (short)uVar15;
        TVar16._2_1_ = (char)(uVar15 >> 0x10);
        TVar16.numFlags.raw = (char)(uVar15 >> 0x18);
        TVar16.rawLen = (int)(uVar15 >> 0x20);
        local_100 = TVar17;
      }
      local_110 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
    }
  }
LAB_001d1a65:
  src = local_110.info;
LAB_001d1a6f:
  iVar3 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (local_a8,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src);
  local_b8 = CONCAT44(extraout_var,iVar3);
  local_e0._8_4_ = 3;
  local_d0 = 0;
  uStack_c8 = 0;
  local_e0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_002f8d00;
  openBrace.info = local_f0;
  openBrace.kind = (undefined2)local_e8;
  openBrace._2_1_ = local_e8._2_1_;
  openBrace.numFlags.raw = local_e8._3_1_;
  openBrace.rawLen = local_e8._4_4_;
  pSVar13 = syntax::SyntaxFactory::structurePattern
                      (&this->factory,openBrace,
                       (SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax> *)
                       &local_e0._M_first,local_110);
  if (local_a8[0].data_ != (pointer)local_a8[0].firstElement) {
    operator_delete(local_a8[0].data_);
  }
  return &pSVar13->super_PatternSyntax;
}

Assistant:

PatternSyntax& Parser::parsePattern() {
    switch (peek().kind) {
        case TokenKind::OpenParenthesis: {
            auto openParen = consume();
            auto& pattern = parsePattern();
            return factory.parenthesizedPattern(openParen, pattern,
                                                expect(TokenKind::CloseParenthesis));
        }
        case TokenKind::Dot: {
            auto dot = consume();
            if (peek(TokenKind::Star))
                return factory.wildcardPattern(dot, consume());
            return factory.variablePattern(dot, expect(TokenKind::Identifier));
        }
        case TokenKind::TaggedKeyword: {
            auto tagged = consume();
            auto name = expect(TokenKind::Identifier);

            PatternSyntax* pattern = nullptr;
            if (isPossiblePattern(peek().kind))
                pattern = &parsePattern();

            return factory.taggedPattern(tagged, name, pattern);
        }
        case TokenKind::ApostropheOpenBrace: {
            auto openBrace = consume();
            Token closeBrace;
            SmallVector<TokenOrSyntax, 4> buffer;

            if (peek(TokenKind::Identifier) && peek(1).kind == TokenKind::Colon) {
                parseList<isIdentifierOrComma, isCloseBrace>(
                    buffer, TokenKind::CloseBrace, TokenKind::Comma, closeBrace, RequireItems::True,
                    diag::ExpectedPattern, [this]() { return &parseMemberPattern(); });
            }
            else {
                parseList<isPossiblePatternOrComma, isCloseBrace>(
                    buffer, TokenKind::CloseBrace, TokenKind::Comma, closeBrace, RequireItems::True,
                    diag::ExpectedPattern, [this]() {
                        auto& pattern = parsePattern();
                        return &factory.orderedStructurePatternMember(pattern);
                    });
            }

            return factory.structurePattern(openBrace, buffer.copy(alloc), closeBrace);
        }
        default:
            break;
    }

    // otherwise, it's either an expression or an error (parseExpression will handle that for us)
    return factory.expressionPattern(parseSubExpression(ExpressionOptions::PatternContext, 0));
}